

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O0

void __thiscall EnvironmentNAV2D::InitializeEnvConfig(EnvironmentNAV2D *this)

{
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x1c0))();
  return;
}

Assistant:

void EnvironmentNAV2D::InitializeEnvConfig()
{
    //aditional to configuration file initialization of EnvNAV2DCfg if necessary

    /*
     //actions
     EnvNAV2DCfg.dXY[0][0] = -1;
     EnvNAV2DCfg.dXY[0][1] = -1;
     EnvNAV2DCfg.dXY[1][0] = -1;
     EnvNAV2DCfg.dXY[1][1] = 0;
     EnvNAV2DCfg.dXY[2][0] = -1;
     EnvNAV2DCfg.dXY[2][1] = 1;
     EnvNAV2DCfg.dXY[3][0] = 0;
     EnvNAV2DCfg.dXY[3][1] = -1;
     EnvNAV2DCfg.dXY[4][0] = 0;
     EnvNAV2DCfg.dXY[4][1] = 1;
     EnvNAV2DCfg.dXY[5][0] = 1;
     EnvNAV2DCfg.dXY[5][1] = -1;
     EnvNAV2DCfg.dXY[6][0] = 1;
     EnvNAV2DCfg.dXY[6][1] = 0;
     EnvNAV2DCfg.dXY[7][0] = 1;
     EnvNAV2DCfg.dXY[7][1] = 1;
     */
    Computedxy();
}